

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::clear(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        *this)

{
  iterator pos;
  iterator local_68;
  iterator local_50;
  Node *local_38;
  InnerMap *pIStack_30;
  size_type local_28;
  
  begin(&local_68,this);
  local_28 = local_68.it_.bucket_index_;
  pIStack_30 = local_68.it_.m_;
  local_38 = local_68.it_.node_;
  while (local_38 != (Node *)0x0) {
    pos.it_.m_ = pIStack_30;
    pos.it_.node_ = local_38;
    pos.it_.bucket_index_ = local_28;
    erase(&local_50,this,pos);
    local_28 = local_50.it_.bucket_index_;
    pIStack_30 = local_50.it_.m_;
    local_38 = local_50.it_.node_;
  }
  return;
}

Assistant:

void clear() { erase(begin(), end()); }